

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
~RegistryWithPred(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  ~RegistryWithPred(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~RegistryWithPred(void) {
    unregisterAll();
  }